

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O1

string * asciidump<unsigned_char_const*>(string *__return_storage_ptr__,uchar *buf,size_t bytelen)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (bytelen != 0) {
    sVar1 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar1 = sVar1 + 1;
    } while (bytelen != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string asciidump(P buf, size_t bytelen)
{
    std::string str;
    str.reserve(bytelen);
    while(bytelen--)
    {
        uint8_t c= *buf++;
        str += (c>=' ' && c<='~')?c:'.';
    }

    return str;
}